

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void MIR_finish(MIR_context_t ctx)

{
  MIR_module_t_conflict *ppMVar1;
  MIR_module_t pMVar2;
  MIR_module_t pMVar3;
  HTAB_MIR_item_t *pHVar4;
  VARR_htab_ind_t *pVVar5;
  MIR_item_t pMVar6;
  io_ctx *piVar7;
  VARR_size_t *__ptr;
  simplify_ctx *psVar8;
  VARR_char *__ptr_00;
  HTAB_val_t *pHVar9;
  machine_code_ctx *pmVar10;
  void *__addr;
  hard_reg_ctx *phVar11;
  HTAB_hard_reg_desc_t *pHVar12;
  VARR_spot_attr_t **ppVVar13;
  uint uVar14;
  MIR_func_t extraout_RAX;
  MIR_func_t pMVar15;
  bitmap_t pVVar16;
  DLIST_LINK_MIR_module_t *pDVar17;
  long *plVar18;
  DLIST_MIR_module_t *pDVar19;
  char *pcVar20;
  MIR_module_t_conflict module;
  char *pcVar21;
  gen_ctx *string;
  gen_ctx *pgVar22;
  gen_ctx *pgVar23;
  gen_ctx *ctx_00;
  long *plVar24;
  MIR_item_t_conflict *ppMVar25;
  long lVar26;
  ulong uVar27;
  int *piVar28;
  gen_ctx *pgVar29;
  gen_ctx *unaff_R14;
  hard_reg_desc_t hVar30;
  
  module = (ctx->all_modules).head;
  if (module != (MIR_module_t_conflict)0x0) {
    unaff_R14 = (gen_ctx *)&ctx->all_modules;
    ppMVar1 = &(ctx->all_modules).tail;
    do {
      pMVar2 = (module->module_link).prev;
      pMVar3 = (module->module_link).next;
      pDVar19 = (DLIST_MIR_module_t *)&(pMVar2->module_link).next;
      if (pMVar2 == (MIR_module_t)0x0) {
        pDVar19 = (DLIST_MIR_module_t *)unaff_R14;
      }
      pDVar19->head = pMVar3;
      if (pMVar3 == (MIR_module_t)0x0) {
        pDVar17 = (DLIST_LINK_MIR_module_t *)ppMVar1;
        if (*ppMVar1 != module) goto LAB_00130648;
      }
      else {
        pDVar17 = &pMVar3->module_link;
      }
      pDVar17->prev = pMVar2;
      (module->module_link).prev = (MIR_module_t)0x0;
      (module->module_link).next = (MIR_module_t)0x0;
      remove_module(ctx,module,1);
      module = (ctx->all_modules).head;
    } while (module != (MIR_module_t_conflict)0x0);
  }
  pcVar21 = (char *)&ctx->environment_module;
  pgVar22 = (gen_ctx *)ctx;
  remove_module(ctx,(MIR_module_t_conflict)pcVar21,0);
  pHVar4 = ctx->module_item_tab;
  if (pHVar4->free_func == (_func_void_MIR_item_t_void_ptr *)0x0) {
LAB_0012fed7:
    pHVar4 = ctx->module_item_tab;
    unaff_R14 = (gen_ctx *)pHVar4->els;
    if ((unaff_R14 == (gen_ctx *)0x0) ||
       (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
       pMVar6 == (MIR_item_t)0x0)) {
LAB_0013064d:
      MIR_finish_cold_36();
LAB_00130652:
      MIR_finish_cold_35();
LAB_00130657:
      MIR_finish_cold_34();
LAB_0013065c:
      MIR_finish_cold_33();
LAB_00130661:
      MIR_finish_cold_32();
LAB_00130666:
      MIR_finish_cold_31();
LAB_0013066b:
      MIR_finish_cold_30();
LAB_00130670:
      MIR_finish_cold_29();
LAB_00130675:
      MIR_finish_cold_28();
LAB_0013067a:
      MIR_finish_cold_27();
LAB_0013067f:
      MIR_finish_cold_26();
LAB_00130684:
      MIR_finish_cold_25();
    }
    else {
      free(pMVar6);
      free(unaff_R14);
      pHVar4->els = (VARR_HTAB_EL_MIR_item_t *)0x0;
      pHVar4 = ctx->module_item_tab;
      unaff_R14 = (gen_ctx *)pHVar4->entries;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130652;
      free(pMVar6);
      free(unaff_R14);
      pHVar4->entries = (VARR_htab_ind_t *)0x0;
      free(ctx->module_item_tab);
      ctx->module_item_tab = (HTAB_MIR_item_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->modules_to_link;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130657;
      free(pMVar6);
      free(unaff_R14);
      ctx->modules_to_link = (VARR_MIR_module_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->temp_ops;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013065c;
      free(pMVar6);
      free(unaff_R14);
      ctx->temp_ops = (VARR_MIR_op_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->func_labels;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130661;
      free(pMVar6);
      free(unaff_R14);
      piVar7->func_labels = (VARR_MIR_label_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->insn_label_string_nums;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130666;
      free(pMVar6);
      free(unaff_R14);
      piVar7->insn_label_string_nums = (VARR_uint64_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->bin_strings;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013066b;
      free(pMVar6);
      free(unaff_R14);
      piVar7->bin_strings = (VARR_MIR_str_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->read_insn_ops;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130670;
      free(pMVar6);
      free(unaff_R14);
      piVar7->read_insn_ops = (VARR_MIR_op_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->proto_vars;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130675;
      free(pMVar6);
      free(unaff_R14);
      piVar7->proto_vars = (VARR_MIR_var_t *)0x0;
      piVar7 = ctx->io_ctx;
      unaff_R14 = (gen_ctx *)piVar7->proto_types;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013067a;
      free(pMVar6);
      free(unaff_R14);
      piVar7->proto_types = (VARR_MIR_type_t *)0x0;
      free(ctx->io_ctx);
      ctx->io_ctx = (io_ctx *)0x0;
      unaff_R14 = (gen_ctx *)ctx->temp_data;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_0013067f;
      free(pMVar6);
      free(unaff_R14);
      ctx->temp_data = (VARR_uint8_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->used_label_p;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_00130684;
      free(pMVar6);
      free(unaff_R14);
      ctx->used_label_p = (VARR_uint8_t *)0x0;
      unaff_R14 = (gen_ctx *)ctx->temp_string;
      if ((unaff_R14 != (gen_ctx *)0x0) &&
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 != (MIR_item_t)0x0)) {
        free(pMVar6);
        free(unaff_R14);
        ctx->temp_string = (VARR_char *)0x0;
        while (unaff_R14 = (gen_ctx *)ctx->unspec_protos, unaff_R14 != (gen_ctx *)0x0) {
          pgVar22 = (gen_ctx *)unaff_R14->ctx;
          pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev;
          if (pgVar22 == (gen_ctx *)0x0) {
            if (pMVar6 == (MIR_item_t)0x0) goto LAB_001306c5;
            free(pMVar6);
            free(unaff_R14);
            ctx->unspec_protos = (VARR_MIR_proto_t *)0x0;
            string_finish(&ctx->string_ctx->strings,&ctx->string_ctx->string_tab);
            pcVar21 = (char *)&ctx->alias_ctx->alias_tab;
            string_finish(&ctx->alias_ctx->aliases,(HTAB_string_t **)pcVar21);
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->alloca_sizes;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_0013068e;
            free(pMVar6);
            free(unaff_R14);
            psVar8->alloca_sizes = (VARR_size_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->anchors;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_00130693;
            free(pMVar6);
            free(unaff_R14);
            psVar8->anchors = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->inline_reg_map;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_00130698;
            free(pMVar6);
            free(unaff_R14);
            psVar8->inline_reg_map = (VARR_MIR_reg_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->labels;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_0013069d;
            free(pMVar6);
            free(unaff_R14);
            psVar8->labels = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->temp_insns;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_001306a2;
            free(pMVar6);
            free(unaff_R14);
            psVar8->temp_insns = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->cold_insns;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_001306a7;
            free(pMVar6);
            free(unaff_R14);
            psVar8->cold_insns = (VARR_MIR_insn_t *)0x0;
            psVar8 = ctx->simplify_ctx;
            unaff_R14 = (gen_ctx *)psVar8->val_tab;
            if ((MIR_item_t)unaff_R14->to_free != (MIR_item_t)0x0) {
              HTAB_val_t_clear((HTAB_val_t *)unaff_R14);
              unaff_R14 = (gen_ctx *)psVar8->val_tab;
            }
            __ptr_00 = *(VARR_char **)&unaff_R14->addr_insn_p;
            if ((__ptr_00 == (VARR_char *)0x0) || (__ptr_00->varr == (char *)0x0))
            goto LAB_001306ac;
            free(__ptr_00->varr);
            free(__ptr_00);
            *(VARR_char **)&unaff_R14->addr_insn_p = (VARR_char *)0x0;
            pHVar9 = psVar8->val_tab;
            unaff_R14 = (gen_ctx *)pHVar9->entries;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_001306b1;
            free(pMVar6);
            free(unaff_R14);
            pHVar9->entries = (VARR_htab_ind_t *)0x0;
            free(psVar8->val_tab);
            psVar8->val_tab = (HTAB_val_t *)0x0;
            free(ctx->simplify_ctx);
            ctx->simplify_ctx = (simplify_ctx *)0x0;
            unaff_R14 = (gen_ctx *)ctx->insn_nops;
            if ((unaff_R14 == (gen_ctx *)0x0) ||
               (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
               pMVar6 == (MIR_item_t)0x0)) goto LAB_001306b6;
            free(pMVar6);
            free(unaff_R14);
            ctx->insn_nops = (VARR_size_t *)0x0;
            goto LAB_00130445;
          }
          if (pMVar6 == (MIR_item_t)0x0) goto LAB_00130639;
          unaff_R14->ctx = (MIR_context_t)((long)&pgVar22[-1].spot_attrs + 7);
          unaff_R14 = *(gen_ctx **)((long)pMVar6 + (long)pgVar22 * 8 + -8);
          __ptr = *(VARR_size_t **)&unaff_R14->debug_level;
          if ((__ptr == (VARR_size_t *)0x0) || (__ptr->varr == (size_t *)0x0)) {
            MIR_finish_cold_4();
            break;
          }
          free(__ptr->varr);
          free(__ptr);
          free(unaff_R14);
        }
        MIR_finish_cold_23();
LAB_00130639:
        MIR_finish_cold_5();
LAB_0013063e:
        MIR_finish_cold_12();
LAB_00130643:
        MIR_finish_cold_6();
LAB_00130648:
        MIR_finish_cold_1();
        goto LAB_0013064d;
      }
    }
    MIR_finish_cold_24();
LAB_0013068e:
    MIR_finish_cold_21();
LAB_00130693:
    MIR_finish_cold_20();
LAB_00130698:
    MIR_finish_cold_19();
LAB_0013069d:
    MIR_finish_cold_18();
LAB_001306a2:
    MIR_finish_cold_17();
LAB_001306a7:
    MIR_finish_cold_16();
LAB_001306ac:
    MIR_finish_cold_15();
LAB_001306b1:
    MIR_finish_cold_14();
LAB_001306b6:
    MIR_finish_cold_13();
LAB_001306bb:
    MIR_finish_cold_10();
LAB_001306c0:
    MIR_finish_cold_9();
LAB_001306c5:
    MIR_finish_cold_22();
LAB_001306ca:
    MIR_finish_cold_11();
    pMVar15 = extraout_RAX;
LAB_001306cf:
    pcVar20 = pMVar15->name;
    pcVar21 = "finish when function %s is not finished";
LAB_001306e6:
    pgVar22 = (gen_ctx *)0x4;
    (*ctx->error_func)(MIR_finish_error,pcVar21,pcVar20);
LAB_001306f0:
    MIR_finish_cold_3();
  }
  else {
    if (pHVar4->els == (VARR_HTAB_EL_MIR_item_t *)0x0) goto LAB_001306f0;
    uVar14 = pHVar4->els_bound;
    if (uVar14 != 0) {
      unaff_R14 = (gen_ctx *)pHVar4->arg;
      uVar27 = 0;
      ppMVar25 = &pHVar4->els->varr->el;
      do {
        if (((HTAB_EL_MIR_item_t *)(ppMVar25 + -1))->hash != 0) {
          pgVar22 = (gen_ctx *)*ppMVar25;
          pcVar21 = (char *)unaff_R14;
          (*pHVar4->free_func)((MIR_item_t_conflict)pgVar22,unaff_R14);
          uVar14 = pHVar4->els_bound;
        }
        uVar27 = uVar27 + 1;
        ppMVar25 = ppMVar25 + 2;
      } while (uVar27 < uVar14);
    }
    pHVar4->els_bound = 0;
    pHVar4->els_num = 0;
    pHVar4->els_start = 0;
    pVVar5 = pHVar4->entries;
    if (pVVar5 != (VARR_htab_ind_t *)0x0) {
      if ((int)pVVar5->els_num != 0) {
        memset(pVVar5->varr,0xff,(pVVar5->els_num & 0xffffffff) << 2);
      }
      goto LAB_0012fed7;
    }
  }
  MIR_finish_cold_2();
LAB_001306fa:
  MIR_finish_cold_8();
LAB_001306ff:
  MIR_finish_cold_7();
  ctx_00 = (gen_ctx *)pgVar22->ctx;
  string = (gen_ctx *)pcVar21;
  pgVar23 = pgVar22;
  if (ctx_00 != (gen_ctx *)0x0) {
    lVar26 = 0x28;
    pgVar29 = (gen_ctx *)0x0;
    do {
      pgVar23 = (gen_ctx *)((DLIST_LINK_MIR_item_t *)&ctx_00->curr_func_item)->prev;
      pgVar29 = (gen_ctx *)((long)&pgVar29->ctx + 1);
      if ((gen_ctx *)ctx_00->ctx <= pgVar29) goto LAB_0013074e;
      pgVar23 = *(gen_ctx **)((long)&pgVar23->ctx + lVar26);
      lVar26 = lVar26 + 0x18;
      free(pgVar23);
      ctx_00 = (gen_ctx *)pgVar22->ctx;
      ctx = (MIR_context_t)pcVar21;
      unaff_R14 = pgVar22;
    } while (ctx_00 != (gen_ctx *)0x0);
  }
  pgVar22 = unaff_R14;
  pcVar21 = (char *)ctx;
  string_finish_cold_6();
LAB_0013074e:
  if (pgVar23 == (gen_ctx *)0x0) {
LAB_00130880:
    string_finish_cold_5();
    ctx_00 = pgVar23;
LAB_00130885:
    string_finish_cold_2();
  }
  else {
    free(pgVar23);
    free(ctx_00);
    pgVar22->ctx = (MIR_context_t)0x0;
    pgVar22 = (gen_ctx *)((gen_ctx *)pcVar21)->ctx;
    if (pgVar22->to_free == (VARR_void_ptr_t *)0x0) {
LAB_0013080a:
      pgVar22 = (gen_ctx *)((gen_ctx *)pcVar21)->ctx;
      pgVar23 = *(gen_ctx **)&pgVar22->addr_insn_p;
      if ((pgVar23 == (gen_ctx *)0x0) ||
         (ctx_00 = (gen_ctx *)((DLIST_LINK_MIR_item_t *)&pgVar23->curr_func_item)->prev,
         ctx_00 == (gen_ctx *)0x0)) {
        pgVar23 = ctx_00;
        string_finish_cold_4();
      }
      else {
        free(ctx_00);
        free(pgVar23);
        *(undefined8 *)&pgVar22->addr_insn_p = 0;
        pgVar22 = (gen_ctx *)((gen_ctx *)pcVar21)->ctx;
        pVVar16 = pgVar22->tied_regs;
        if ((pVVar16 != (bitmap_t)0x0) &&
           (pgVar23 = (gen_ctx *)pVVar16->varr, pgVar23 != (gen_ctx *)0x0)) {
          free(pgVar23);
          free(pVVar16);
          pgVar22->tied_regs = (bitmap_t)0x0;
          free((gen_ctx *)((gen_ctx *)pcVar21)->ctx);
          ((gen_ctx *)pcVar21)->ctx = (MIR_context_t)0x0;
          return;
        }
      }
      string_finish_cold_3();
      goto LAB_00130880;
    }
    if (*(long *)&pgVar22->addr_insn_p == 0) goto LAB_00130885;
    uVar14 = pgVar22->optimize_level;
    if (uVar14 != 0) {
      pgVar23 = (gen_ctx *)pgVar22->curr_func_item;
      uVar27 = 0;
      lVar26 = *(long *)(*(long *)&pgVar22->addr_insn_p + 0x10) + 8;
      do {
        if (*(int *)(lVar26 + -8) != 0) {
          ctx_00 = pgVar23;
          (*(code *)pgVar22->to_free)();
          uVar14 = pgVar22->optimize_level;
        }
        uVar27 = uVar27 + 1;
        lVar26 = lVar26 + 0x20;
      } while (uVar27 < uVar14);
    }
    pgVar22->optimize_level = 0;
    pgVar22->ctx = (MIR_context_t)0x0;
    pVVar16 = pgVar22->tied_regs;
    if (pVVar16 != (bitmap_t)0x0) {
      if ((int)pVVar16->els_num != 0) {
        ctx_00 = (gen_ctx *)pVVar16->varr;
        string = (gen_ctx *)0xff;
        memset(ctx_00,0xff,(pVVar16->els_num & 0xffffffff) << 2);
      }
      goto LAB_0013080a;
    }
  }
  string_finish_cold_1();
  if (ctx_00->call_used_hard_regs[4] == (bitmap_t)0x0) {
    pVVar16 = (bitmap_t)malloc(0x38);
    ctx_00->call_used_hard_regs[4] = pVVar16;
    if (pVVar16 != (bitmap_t)0x0) {
      pVVar16->els_num = 0;
      *(undefined4 *)&pVVar16[2].els_num = 0;
      pcVar21 = get_ctx_str((MIR_context_t)ctx_00,(char *)string);
      pVVar16->size = (size_t)pcVar21;
      pVVar16->varr = (bitmap_el_t *)0x0;
      pVVar16[1].els_num = 0;
      DLIST_MIR_module_t_append
                ((DLIST_MIR_module_t *)(ctx_00->call_used_hard_regs + 7),
                 (MIR_module_t_conflict)ctx_00->call_used_hard_regs[4]);
      return;
    }
    pcVar21 = "Not enough memory for module %s creation";
    plVar24 = (long *)0x3;
  }
  else {
    string = (gen_ctx *)ctx_00->call_used_hard_regs[4]->size;
    pcVar21 = "Creating module when previous module %s is not finished";
    plVar24 = (long *)0x6;
  }
  (*(code *)ctx_00->curr_func_item)((MIR_error_type_t)plVar24,pcVar21,string);
  if ((plVar24 == (long *)0x0) || (pcVar21 == (char *)0x0)) {
    DLIST_MIR_module_t_append_cold_1();
  }
  else {
    lVar26 = plVar24[1];
    if (lVar26 == 0) {
      plVar18 = plVar24;
      if (*plVar24 == 0) goto LAB_00130956;
      goto LAB_00130975;
    }
    if (*(long *)(lVar26 + 0x28) == 0) {
      plVar18 = (long *)(lVar26 + 0x28);
LAB_00130956:
      *plVar18 = (long)pcVar21;
      pcVar21[0x28] = '\0';
      pcVar21[0x29] = '\0';
      pcVar21[0x2a] = '\0';
      pcVar21[0x2b] = '\0';
      pcVar21[0x2c] = '\0';
      pcVar21[0x2d] = '\0';
      pcVar21[0x2e] = '\0';
      pcVar21[0x2f] = '\0';
      *(long *)(pcVar21 + 0x20) = lVar26;
      plVar24[1] = (long)pcVar21;
      return;
    }
  }
  DLIST_MIR_module_t_append_cold_2();
LAB_00130975:
  DLIST_MIR_module_t_append_cold_3();
  return;
LAB_00130445:
  pmVar10 = ctx->machine_code_ctx;
  unaff_R14 = (gen_ctx *)pmVar10->code_holders;
  if (unaff_R14 != (gen_ctx *)0x0) {
    if ((gen_ctx *)unaff_R14->ctx != (gen_ctx *)0x0) {
      pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev;
      if (pMVar6 != (MIR_item_t)0x0) goto code_r0x0013046d;
      goto LAB_00130643;
    }
    pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev;
    if (pMVar6 == (MIR_item_t)0x0) goto LAB_001306ca;
    free(pMVar6);
    free(unaff_R14);
    unaff_R14 = (gen_ctx *)0x0;
    pmVar10->code_holders = (VARR_code_holder_t *)0x0;
    pgVar22 = (gen_ctx *)ctx->machine_code_ctx;
    free(pgVar22);
    ctx->machine_code_ctx = (machine_code_ctx *)0x0;
    phVar11 = ctx->hard_reg_ctx;
    pHVar12 = phVar11->hard_reg_desc_tab;
    if (pHVar12->free_func == (_func_void_hard_reg_desc_t_void_ptr *)0x0) goto LAB_0013055c;
    if (pHVar12->els != (VARR_HTAB_EL_hard_reg_desc_t *)0x0) {
      uVar14 = pHVar12->els_bound;
      if (uVar14 != 0) {
        unaff_R14 = (gen_ctx *)pHVar12->arg;
        uVar27 = 0;
        piVar28 = &(pHVar12->els->varr->el).num;
        do {
          if (piVar28[-4] != 0) {
            pgVar22 = (gen_ctx *)((hard_reg_desc_t *)(piVar28 + -2))->name;
            hVar30.num = *piVar28;
            hVar30.name = (char *)pgVar22;
            hVar30._12_4_ = 0;
            pcVar21 = (char *)(ulong)(uint)*piVar28;
            (*pHVar12->free_func)(hVar30,unaff_R14);
            uVar14 = pHVar12->els_bound;
          }
          uVar27 = uVar27 + 1;
          piVar28 = piVar28 + 6;
        } while (uVar27 < uVar14);
      }
      pHVar12->els_bound = 0;
      pHVar12->els_num = 0;
      pHVar12->els_start = 0;
      pVVar5 = pHVar12->entries;
      if (pVVar5 == (VARR_htab_ind_t *)0x0) goto LAB_001306ff;
      if ((int)pVVar5->els_num != 0) {
        memset(pVVar5->varr,0xff,(pVVar5->els_num & 0xffffffff) << 2);
      }
LAB_0013055c:
      pHVar12 = phVar11->hard_reg_desc_tab;
      unaff_R14 = (gen_ctx *)pHVar12->els;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_001306bb;
      free(pMVar6);
      free(unaff_R14);
      pHVar12->els = (VARR_HTAB_EL_hard_reg_desc_t *)0x0;
      pHVar12 = phVar11->hard_reg_desc_tab;
      unaff_R14 = (gen_ctx *)pHVar12->entries;
      if ((unaff_R14 == (gen_ctx *)0x0) ||
         (pMVar6 = ((DLIST_LINK_MIR_item_t *)&unaff_R14->curr_func_item)->prev,
         pMVar6 == (MIR_item_t)0x0)) goto LAB_001306c0;
      free(pMVar6);
      free(unaff_R14);
      unaff_R14 = (gen_ctx *)0x0;
      pHVar12->entries = (VARR_htab_ind_t *)0x0;
      free(phVar11->hard_reg_desc_tab);
      phVar11->hard_reg_desc_tab = (HTAB_hard_reg_desc_t *)0x0;
      free(ctx->hard_reg_ctx);
      ctx->hard_reg_ctx = (hard_reg_ctx *)0x0;
      pMVar15 = ctx->curr_func;
      if (pMVar15 != (MIR_func_t)0x0) goto LAB_001306cf;
      if (ctx->curr_module == (MIR_module_t_conflict)0x0) {
        free(ctx->string_ctx);
        free(ctx->alias_ctx);
        free(ctx);
        return;
      }
      pcVar20 = ctx->curr_module->name;
      pcVar21 = "finish when module %s is not finished";
      goto LAB_001306e6;
    }
    goto LAB_001306fa;
  }
  goto LAB_0013063e;
code_r0x0013046d:
  ppVVar13 = &((gen_ctx *)unaff_R14->ctx)[-1].spot_attrs;
  unaff_R14->ctx = (MIR_context_t)((long)ppVVar13 + 7);
  __addr = *(void **)((long)&pMVar6[2].item_link + (long)ppVVar13 * 0x18 + 8);
  pcVar21 = (char *)((long)(&pMVar6[2].ref_def)[(long)ppVVar13 * 3] - (long)__addr);
  munmap(__addr,(size_t)pcVar21);
  goto LAB_00130445;
}

Assistant:

void MIR_finish (MIR_context_t ctx) {
  interp_finish (ctx);
  remove_all_modules (ctx);
  HTAB_DESTROY (MIR_item_t, module_item_tab);
  VARR_DESTROY (MIR_module_t, modules_to_link);
  VARR_DESTROY (MIR_op_t, temp_ops);
#if !MIR_NO_SCAN
  scan_finish (ctx);
#endif
#if !MIR_NO_IO
  io_finish (ctx);
#endif
  VARR_DESTROY (uint8_t, temp_data);
  VARR_DESTROY (uint8_t, used_label_p);
  VARR_DESTROY (char, temp_string);
  while (VARR_LENGTH (MIR_proto_t, unspec_protos) != 0) {
    MIR_proto_t proto = VARR_POP (MIR_proto_t, unspec_protos);
    VARR_DESTROY (MIR_var_t, proto->args);
    free (proto);
  }
  VARR_DESTROY (MIR_proto_t, unspec_protos);
  string_finish (&strings, &string_tab);
  string_finish (&aliases, &alias_tab);
  simplify_finish (ctx);
  VARR_DESTROY (size_t, insn_nops);
  code_finish (ctx);
  hard_reg_name_finish (ctx);
  if (curr_func != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when function %s is not finished",
                              curr_func->name);
  if (curr_module != NULL)
    MIR_get_error_func (ctx) (MIR_finish_error, "finish when module %s is not finished",
                              curr_module->name);
  free (ctx->string_ctx);
  free (ctx->alias_ctx);
  free (ctx);
  ctx = NULL;
}